

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Naming.hpp
# Opt level: O2

string * HRRVarName(string *__return_storage_ptr__,int am1,int am2,string *ketstr)

{
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"HRR",&local_49);
  ArrVarName(__return_storage_ptr__,am1,am2,ketstr,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

inline std::string HRRVarName(int am1, int am2, const std::string & ketstr)
{
    return ArrVarName(am1, am2, ketstr, "HRR");
}